

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>_>_> * __thiscall
kj::Own<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>_>_>::operator=
          (Own<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>_>_> *this,
          Own<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>_>_> *other)

{
  Disposer *this_00;
  PromiseFulfiller<kj::Own<capnp::ClientHook>_> *object;
  PromiseFulfiller<kj::Own<capnp::ClientHook>_> *ptrCopy;
  Disposer *disposerCopy;
  Own<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>_>_> *other_local;
  Own<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>_>_> *this_local;
  
  this_00 = this->disposer;
  object = this->ptr;
  this->disposer = other->disposer;
  this->ptr = other->ptr;
  other->ptr = (PromiseFulfiller<kj::Own<capnp::ClientHook>_> *)0x0;
  if (object != (PromiseFulfiller<kj::Own<capnp::ClientHook>_> *)0x0) {
    Disposer::dispose<kj::PromiseFulfiller<kj::Own<capnp::ClientHook>>>(this_00,object);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }